

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

void __thiscall FirewirePort::StopCycleStartPacket(FirewirePort *this)

{
  raw1394handle_t prVar1;
  undefined2 uVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  quadlet_t data_stop_cmc;
  
  data_stop_cmc = 0x10000;
  prVar1 = this->handle;
  uVar2 = raw1394_get_local_id(prVar1);
  iVar3 = raw1394_write(prVar1,uVar2,0xfffff0000000,4,&data_stop_cmc);
  pcVar5 = "FirewirePort::Init: error, can NOT disable cycle start packet";
  if (iVar3 == 0) {
    pcVar5 = "FirewirePort::Init: successfully disabled cycle start packet";
  }
  poVar4 = std::operator<<((this->super_BasePort).outStr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void FirewirePort::StopCycleStartPacket(void)
{
    // IMPORTANT: Disable Cycle Start Packet, no isochronous
    int rc = 0;  // return code
    quadlet_t data_stop_cmc = bswap_32(0x100);
    rc = raw1394_write(handle,
                       raw1394_get_local_id(handle),
                       CSR_REGISTER_BASE + CSR_STATE_CLEAR,
                       4,
                       &data_stop_cmc);
    if (rc) {
        outStr << "FirewirePort::Init: error, can NOT disable cycle start packet" << std::endl;
    } else {
        outStr << "FirewirePort::Init: successfully disabled cycle start packet" << std::endl;
    }
}